

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_clearfavors(CHAR_DATA *ch,char *argument)

{
  char *in_RSI;
  CHAR_DATA *in_RDI;
  int i;
  CHAR_DATA *victim;
  char *in_stack_000023e0;
  CHAR_DATA *in_stack_000023e8;
  void *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar1;
  
  if (*in_RSI != '\0') {
    in_RDI = get_char_world(in_stack_000023e8,in_stack_000023e0);
  }
  if (in_RDI == (CHAR_DATA *)0x0) {
    send_to_char(in_RSI,(CHAR_DATA *)0x0);
  }
  else {
    for (iVar1 = 0; iVar1 < 5; iVar1 = iVar1 + 1) {
      in_RDI->pcdata->devildata[iVar1] = 0;
      in_RDI->pcdata->greaterdata[iVar1] = 0;
      in_RDI->pcdata->lesserdata[iVar1] = 0;
    }
    act(in_RSI,in_RDI,(void *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8,0)
    ;
  }
  return;
}

Assistant:

void do_clearfavors(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *victim;
	int i;

	if (argument[0] == '\0')
		victim = ch;
	else
		victim = get_char_world(ch, argument);

	if (!victim)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	for (i = 0; i < MAX_DEVIL; i++)
	{
		victim->pcdata->devildata[i] = FAVOR_NONE;
		victim->pcdata->greaterdata[i] = FAVOR_NONE;
		victim->pcdata->lesserdata[i] = FAVOR_NONE;
	}

	act("$N's favors cleared.", ch, 0, victim, TO_CHAR);
}